

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O0

glsl_type *
process_array_type(YYLTYPE *loc,glsl_type *base,ast_array_specifier *array_specifier,
                  _mesa_glsl_parse_state *state)

{
  bool bVar1;
  uint array_size_00;
  exec_node *peStack_40;
  uint array_size;
  exec_node *node;
  glsl_type *array_type;
  _mesa_glsl_parse_state *state_local;
  ast_array_specifier *array_specifier_local;
  glsl_type *base_local;
  YYLTYPE *loc_local;
  
  node = (exec_node *)base;
  if (array_specifier != (ast_array_specifier *)0x0) {
    bVar1 = glsl_type::is_array(base);
    if ((bVar1) &&
       (bVar1 = _mesa_glsl_parse_state::check_arrays_of_arrays_allowed(state,loc), !bVar1)) {
      loc_local = (YYLTYPE *)&glsl_type::_error_type;
      return (glsl_type *)loc_local;
    }
    peStack_40 = exec_list::get_tail_raw(&array_specifier->array_dimensions);
    while (bVar1 = exec_node::is_head_sentinel(peStack_40), ((bVar1 ^ 0xffU) & 1) != 0) {
      array_size_00 = process_array_size(peStack_40,state);
      node = (exec_node *)glsl_type::get_array_instance((glsl_type *)node,array_size_00,0);
      peStack_40 = peStack_40->prev;
    }
  }
  return (glsl_type *)node;
}

Assistant:

static const glsl_type *
process_array_type(YYLTYPE *loc, const glsl_type *base,
                   ast_array_specifier *array_specifier,
                   struct _mesa_glsl_parse_state *state)
{
   const glsl_type *array_type = base;

   if (array_specifier != NULL) {
      if (base->is_array()) {

         /* From page 19 (page 25) of the GLSL 1.20 spec:
          *
          * "Only one-dimensional arrays may be declared."
          */
         if (!state->check_arrays_of_arrays_allowed(loc)) {
            return glsl_type::error_type;
         }
      }

      for (exec_node *node = array_specifier->array_dimensions.get_tail_raw();
           !node->is_head_sentinel(); node = node->prev) {
         unsigned array_size = process_array_size(node, state);
         array_type = glsl_type::get_array_instance(array_type, array_size);
      }
   }

   return array_type;
}